

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Part.cpp
# Opt level: O2

void __thiscall MT32Emu::Part::Part(Part *this,Synth *useSynth,uint usePartNum)

{
  TimbreParam *pTVar1;
  
  this->_vptr_Part = (_func_int **)&PTR__Part_00133a68;
  (this->activePolys).firstPoly = (Poly *)0x0;
  (this->activePolys).lastPoly = (Poly *)0x0;
  this->synth = useSynth;
  this->partNum = usePartNum;
  this->patchCache[0].dirty = true;
  this->holdpedal = false;
  this->patchTemp = useSynth->mt32ram->patchTemp + usePartNum;
  if (usePartNum == 8) {
    pTVar1 = (TimbreParam *)0x0;
  }
  else {
    sprintf(this->name,"Part %d",(ulong)(usePartNum + 1));
    pTVar1 = this->synth->mt32ram->timbreTemp + this->partNum;
  }
  this->timbreTemp = pTVar1;
  this->currentInstr[0] = '\0';
  *(undefined4 *)(this->currentInstr + 10) = 0x6400ff00;
  this->pitchBend = 0;
  memset(&this->activePartialCount,0,0x1a8);
  return;
}

Assistant:

Part::Part(Synth *useSynth, unsigned int usePartNum) {
	synth = useSynth;
	partNum = usePartNum;
	patchCache[0].dirty = true;
	holdpedal = false;
	patchTemp = &synth->mt32ram.patchTemp[partNum];
	if (usePartNum == 8) {
		// Nasty hack for rhythm
		timbreTemp = NULL;
	} else {
		sprintf(name, "Part %d", partNum + 1);
		timbreTemp = &synth->mt32ram.timbreTemp[partNum];
	}
	currentInstr[0] = 0;
	currentInstr[10] = 0;
	volumeOverride = 255;
	modulation = 0;
	expression = 100;
	pitchBend = 0;
	activePartialCount = 0;
	activeNonReleasingPolyCount = 0;
	memset(patchCache, 0, sizeof(patchCache));
}